

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateDestroyAmountRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::CreateDestroyAmountRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::CreateDestroyAmountRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_6c0;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_608 [4];
  JsonClassBase<cfd::js::api::json::RawTransactionResponse> local_5e8 [4];
  undefined1 local_5c8 [8];
  RawTransactionResponse res_2;
  undefined1 local_568 [8];
  RawTransactionResponseStruct response;
  CreateDestroyAmountRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_180 [8];
  CreateDestroyAmountRequest req;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::CreateDestroyAmountRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req.fee_._88_8_ = call_function;
  CreateDestroyAmountRequest::CreateDestroyAmountRequest((CreateDestroyAmountRequest *)local_180);
  core::JsonClassBase<cfd::js::api::json::CreateDestroyAmountRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::CreateDestroyAmountRequest> *)local_180,
             request_message);
  CreateDestroyAmountRequest::ConvertToStruct
            ((CreateDestroyAmountRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (CreateDestroyAmountRequest *)local_180);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::CreateDestroyAmountRequestStruct_&)>
  ::operator()((RawTransactionResponseStruct *)local_568,call_function,
               (CreateDestroyAmountRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    RawTransactionResponse::RawTransactionResponse((RawTransactionResponse *)local_5c8);
    RawTransactionResponse::ConvertFromStruct
              ((RawTransactionResponse *)local_5c8,(RawTransactionResponseStruct *)local_568);
    core::JsonClassBase<cfd::js::api::json::RawTransactionResponse>::Serialize_abi_cxx11_(local_5e8)
    ;
    std::__cxx11::string::operator=((string *)this,(string *)local_5e8);
    std::__cxx11::string::~string((string *)local_5e8);
    RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_5c8);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_6c0,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_608);
    std::__cxx11::string::operator=((string *)this,(string *)local_608);
    std::__cxx11::string::~string((string *)local_608);
    ErrorResponse::~ErrorResponse(&local_6c0);
  }
  res_2._87_1_ = 1;
  RawTransactionResponseStruct::~RawTransactionResponseStruct
            ((RawTransactionResponseStruct *)local_568);
  CreateDestroyAmountRequestStruct::~CreateDestroyAmountRequestStruct
            ((CreateDestroyAmountRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CreateDestroyAmountRequest::~CreateDestroyAmountRequest((CreateDestroyAmountRequest *)local_180);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}